

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O0

bool getUnitVector(Vector3 *in,Vector3 *out)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  RealScalar RVar1;
  double norm;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffb8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffc8;
  VectorFixSize<3U> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  iDynTree::toEigen<3U>(in_stack_ffffffffffffffd8);
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
          ::norm(in_stack_ffffffffffffffb8);
  if ((RVar1 != 0.0) || (NAN(RVar1))) {
    *in_RSI = *in_RDI;
    in_RSI[1] = in_RDI[1];
    in_RSI[2] = in_RDI[2];
    iDynTree::toEigen<3U>(in_stack_ffffffffffffffd8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    normalize(in_stack_ffffffffffffffc8);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool getUnitVector(const iDynTree::Vector3& in, iDynTree::Vector3& out)
{
    using iDynTree::toEigen;

    double norm{toEigen(in).norm()};
    if (norm == 0)
    {
        return false;
    }

    out = in;
    toEigen(out).normalize();
    return true;
}